

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseEventFunction(StructuralParser *this)

{
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ModuleBase *pMVar4;
  undefined4 extraout_var;
  Identifier IVar5;
  ConcreteType *o;
  VariableDeclaration *pVVar6;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *pvVar7;
  Block *o_00;
  pool_ptr<soul::AST::Function> local_168;
  Scope local_160;
  char *local_158;
  string *local_150;
  pool_ref<soul::AST::VariableDeclaration> local_148;
  bool local_139;
  void *local_138;
  Context local_130;
  VariableDeclaration *local_118;
  VariableDeclaration *v_1;
  Expression *type_1;
  string *local_100;
  pool_ref<soul::AST::VariableDeclaration> local_f8;
  bool local_e9;
  void *local_e8;
  Context local_e0;
  VariableDeclaration *local_c8;
  VariableDeclaration *v;
  Expression *type;
  Scope local_b0;
  pool_ref<soul::AST::Function> local_a8;
  undefined1 local_a0 [8];
  ScopedScope scope;
  Function *f;
  Identifier name;
  Context context;
  CompileMessage local_50;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *local_18;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *functions;
  StructuralParser *this_local;
  
  functions = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
               *)this;
  pMVar4 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  iVar2 = (*(pMVar4->super_ASTObject)._vptr_ASTObject[0xc])();
  local_18 = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
              *)CONCAT44(extraout_var,iVar2);
  if (local_18 !=
      (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
       *)0x0) {
    pMVar4 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
    uVar3 = (*(pMVar4->super_ASTObject)._vptr_ASTObject[4])();
    if ((uVar3 & 1) != 0) goto LAB_0040ad48;
  }
  Errors::noEventFunctionsAllowed<>();
  (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_50);
  CompileMessage::~CompileMessage(&local_50);
LAB_0040ad48:
  getContext((Context *)&name,this);
  IVar5 = parseIdentifierWithMaxLength(this,0x80);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
  scope.oldScope = (Scope *)allocate<soul::AST::Function,soul::AST::Context&>(this,(Context *)&name)
  ;
  ScopedScope::ScopedScope((ScopedScope *)local_a0,this,&((Function *)scope.oldScope)->super_Scope);
  this_00 = local_18;
  pool_ref<soul::AST::Function>::pool_ref<soul::AST::Function,void>
            (&local_a8,(Function *)scope.oldScope);
  std::
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ::push_back(this_00,&local_a8);
  pool_ref<soul::AST::Function>::~pool_ref(&local_a8);
  type._4_4_ = 1;
  o = allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::PrimitiveType::Primitive>
                (this,(Context *)&name,(Primitive *)((long)&type + 4));
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::ConcreteType,void>
            ((pool_ptr<soul::AST::Expression> *)&local_b0,o);
  scope.oldScope[6]._vptr_Scope = local_b0._vptr_Scope;
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&local_b0);
  scope.oldScope[7]._vptr_Scope = (_func_int **)IVar5.name;
  AST::Context::operator=((Context *)(scope.oldScope + 8),(Context *)&name);
  *(undefined1 *)((long)&scope.oldScope[0x19]._vptr_Scope + 4) = 1;
  v = (VariableDeclaration *)parseType(this,functionParameter);
  getContext(&local_e0,this);
  local_e8 = (void *)0x0;
  local_e9 = false;
  pVVar6 = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                     (this,&local_e0,(Expression *)v,&local_e8,&local_e9);
  AST::Context::~Context(&local_e0);
  pvVar7 = (vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            *)(scope.oldScope + 0xb);
  local_c8 = pVVar6;
  pool_ref<soul::AST::VariableDeclaration>::pool_ref<soul::AST::VariableDeclaration,void>
            (&local_f8,pVVar6);
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ::push_back(pvVar7,&local_f8);
  pool_ref<soul::AST::VariableDeclaration>::~pool_ref(&local_f8);
  local_c8->isFunctionParameter = true;
  local_100 = (string *)parseIdentifier(this);
  (local_c8->name).name = local_100;
  type_1 = (Expression *)anon_var_dwarf_10ee90;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
  if (bVar1) {
    v_1 = (VariableDeclaration *)parseType(this,functionParameter);
    getContext(&local_130,this);
    local_138 = (void *)0x0;
    local_139 = false;
    pVVar6 = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                       (this,&local_130,(Expression *)v_1,&local_138,&local_139);
    AST::Context::~Context(&local_130);
    pvVar7 = (vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
              *)(scope.oldScope + 0xb);
    local_118 = pVVar6;
    pool_ref<soul::AST::VariableDeclaration>::pool_ref<soul::AST::VariableDeclaration,void>
              (&local_148,pVVar6);
    std::
    vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
    ::push_back(pvVar7,&local_148);
    pool_ref<soul::AST::VariableDeclaration>::~pool_ref(&local_148);
    local_118->isFunctionParameter = true;
    local_150 = (string *)parseIdentifier(this);
    (local_118->name).name = local_150;
  }
  local_158 = ")";
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
  pool_ptr<soul::AST::Function>::pool_ptr<soul::AST::Function,void>
            (&local_168,(Function *)scope.oldScope);
  o_00 = parseBracedBlock(this,&local_168);
  pool_ptr<soul::AST::Block>::pool_ptr<soul::AST::Block,void>
            ((pool_ptr<soul::AST::Block> *)&local_160,o_00);
  scope.oldScope[0x1a]._vptr_Scope = local_160._vptr_Scope;
  pool_ptr<soul::AST::Block>::~pool_ptr((pool_ptr<soul::AST::Block> *)&local_160);
  pool_ptr<soul::AST::Function>::~pool_ptr(&local_168);
  ScopedScope::~ScopedScope((ScopedScope *)local_a0);
  AST::Context::~Context((Context *)&name);
  return;
}

Assistant:

void parseEventFunction()
    {
        auto functions = module->getFunctionList();

        if (functions == nullptr || ! module->isProcessor())
            throwError (Errors::noEventFunctionsAllowed());

        auto context = getContext();
        auto name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        expect (Operator::openParen);
        auto& f = allocate<AST::Function> (context);
        ScopedScope scope (*this, f);

        functions->push_back (f);
        f.returnType = allocate<AST::ConcreteType> (context, PrimitiveType::void_);
        f.name = name;
        f.nameLocation = context;
        f.eventFunction = true;

        // Event functions have either 1 argument (the type of the event) or two arguments
        // (an index followed by the type of the event) if the input is an event array

        {
            auto& type = parseType (ParseTypeContext::functionParameter);
            auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
            f.parameters.push_back (v);
            v.isFunctionParameter = true;
            v.name = parseIdentifier();
        }

        if (matchIf (Operator::comma))
        {
            auto& type = parseType (ParseTypeContext::functionParameter);
            auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
            f.parameters.push_back (v);
            v.isFunctionParameter = true;
            v.name = parseIdentifier();
        }

        expect (Operator::closeParen);
        f.block = parseBracedBlock (f);
    }